

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

BoxArray * __thiscall amrex::BoxArray::surroundingNodes(BoxArray *this,int dir)

{
  BoxArray *pBVar1;
  BATcoarsenRatio in_SIL;
  IndexType typ;
  BoxArray *in_stack_ffffffffffffff98;
  IndexType local_48;
  undefined1 local_44;
  undefined4 local_38;
  undefined8 local_30;
  undefined8 local_10;
  
  local_44 = in_SIL;
  local_48 = ixType(in_stack_ffffffffffffff98);
  local_30 = &stack0xffffffffffffffb8;
  local_48.itype = 1 << (local_44 & 0x1f) | local_48.itype;
  local_38 = 1;
  local_10 = local_30;
  pBVar1 = convert((BoxArray *)local_30,local_48);
  return pBVar1;
}

Assistant:

BoxArray&
BoxArray::surroundingNodes (int dir)
{
    IndexType typ = ixType();
    typ.setType(dir, IndexType::NODE);
    return this->convert(typ);
}